

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O3

void __thiscall QPDFMatrix::QPDFMatrix(QPDFMatrix *this)

{
  this->a = 1.0;
  this->b = 0.0;
  this->c = 0.0;
  this->d = 1.0;
  this->e = 0.0;
  this->f = 0.0;
  return;
}

Assistant:

QPDFMatrix::QPDFMatrix() :
    a(1.0),
    b(0.0),
    c(0.0),
    d(1.0),
    e(0.0),
    f(0.0)
{
}